

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::AssertionStats::AssertionStats(AssertionStats *this,AssertionStats *param_1)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  undefined4 uVar6;
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_00188e70;
  AssertionResult::AssertionResult(&this->assertionResult,&param_1->assertionResult);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,&param_1->infoMessages);
  (this->totals).testCases.failedButOk = (param_1->totals).testCases.failedButOk;
  iVar5 = (param_1->totals).error;
  uVar6 = *(undefined4 *)&(param_1->totals).field_0x4;
  sVar1 = (param_1->totals).assertions.passed;
  sVar2 = (param_1->totals).assertions.failed;
  sVar3 = (param_1->totals).assertions.failedButOk;
  sVar4 = (param_1->totals).testCases.failed;
  (this->totals).testCases.passed = (param_1->totals).testCases.passed;
  (this->totals).testCases.failed = sVar4;
  (this->totals).assertions.failed = sVar2;
  (this->totals).assertions.failedButOk = sVar3;
  (this->totals).error = iVar5;
  *(undefined4 *)&(this->totals).field_0x4 = uVar6;
  (this->totals).assertions.passed = sVar1;
  return;
}

Assistant:

AssertionStats( AssertionStats const& )              = default;